

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgest.cpp
# Opt level: O1

void Gesture1_Do_proc(Am_Object *cmd)

{
  char cVar1;
  Am_Value *pAVar2;
  long *plVar3;
  ostream *poVar4;
  double dVar5;
  Am_Object inter;
  Am_Value v;
  Am_Object local_20 [8];
  Am_Value local_18;
  
  Am_Object::Get_Object((ushort)local_20,(ulong)cmd);
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_Value::operator=(&local_18,pAVar2);
  cVar1 = Am_Value::Valid();
  if (cVar1 == '\0') {
    plVar3 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"** UNRECOGNIZED",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"** Recognized: ",0xf);
    plVar3 = (long *)operator<<((ostream *)&std::cout,&local_18);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  }
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(nap = ",7);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_20,0x141);
  dVar5 = Am_Value::operator_cast_to_double(pAVar2);
  poVar4 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", dist=",7);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_20,0x142);
  dVar5 = Am_Value::operator_cast_to_double(pAVar2);
  poVar4 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Gesture1_Do, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Value v;

  v = cmd.Peek(Am_VALUE);
  if (v.Valid())
    cout << "** Recognized: " << v << endl;
  else
    cout << "** UNRECOGNIZED" << endl;

  cout << "(nap = " << (double)inter.Get(Am_NONAMBIGUITY_PROB)
       << ", dist=" << (double)inter.Get(Am_DIST_TO_MEAN) << ")" << endl;
}